

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::ZoneHeap::_releaseDynamic(ZoneHeap *this,void *p,size_t size)

{
  uint8_t **ppuVar1;
  ulong *puVar2;
  Zone *pZVar3;
  DynamicBlock *pDVar4;
  Block *pBVar5;
  char cVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Error EVar9;
  DynamicBlock **ppDVar10;
  ZoneHeap *pZVar11;
  ZoneHeap *__dest;
  ZoneHeap *pZVar12;
  ZoneHeap *extraout_RAX;
  Slot *pSVar13;
  sbyte sVar14;
  sbyte sVar15;
  ZoneHeap *in_RCX;
  ZoneHeap *pZVar16;
  Slot *pSVar17;
  Block *pBVar18;
  DynamicBlock **ppDVar19;
  ZoneHeap *extraout_RDX;
  Slot *extraout_RDX_00;
  ZoneHeap *sizeOfT;
  ZoneHeap *extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t size_00;
  Slot *pSVar20;
  size_t extraout_RDX_04;
  ulong extraout_RDX_05;
  ZoneHeap *extraout_RDX_06;
  long extraout_RDX_07;
  Block *pBVar21;
  long extraout_RDX_08;
  ZoneHeap *unaff_RBX;
  ZoneHeap *unaff_RBP;
  uint uVar22;
  ZoneHeap *pZVar23;
  ZoneHeap *this_00;
  ZoneHeap *pZVar24;
  ulong in_R8;
  ulong uVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ZoneHeap *pZVar33;
  ZoneHeap *pZVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  size_t sStack_128;
  ZoneHeap *pZStack_120;
  ZoneHeap *pZStack_118;
  ZoneHeap *pZStack_110;
  ZoneHeap *pZStack_100;
  size_t asStack_f8 [2];
  ZoneHeap *pZStack_e8;
  ZoneHeap *pZStack_e0;
  ZoneHeap *pZStack_d8;
  undefined8 uStack_d0;
  ulong uStack_c8;
  uint uStack_bc;
  ZoneHeap *pZStack_b8;
  ZoneHeap *pZStack_b0;
  ZoneHeap *pZStack_a8;
  ZoneHeap *pZStack_a0;
  ZoneHeap *pZStack_98;
  ZoneHeap *pZStack_90;
  ZoneHeap *pZStack_80;
  ZoneHeap *pZStack_70;
  ZoneHeap *pZStack_68;
  ZoneHeap *pZStack_60;
  code *pcStack_58;
  ZoneHeap *pZStack_48;
  ulong uStack_40;
  
  if (this->_zone == (Zone *)0x0) {
    _releaseDynamic();
  }
  else {
    pZVar34 = *(ZoneHeap **)((long)p + -8);
    ppDVar10 = &this->_dynamicBlocks;
    ppDVar19 = ppDVar10;
    do {
      in_RCX = (ZoneHeap *)*ppDVar19;
      if (in_RCX == pZVar34) break;
      ppDVar19 = (DynamicBlock **)in_RCX->_slots;
    } while (in_RCX != (ZoneHeap *)0x0);
    this = pZVar34;
    if (in_RCX != (ZoneHeap *)0x0) {
      pZVar3 = pZVar34->_zone;
      pDVar4 = (DynamicBlock *)pZVar34->_slots[0];
      ppDVar19 = (DynamicBlock **)&pZVar3->_end;
      if (pZVar3 == (Zone *)0x0) {
        ppDVar19 = ppDVar10;
      }
      *ppDVar19 = pDVar4;
      if (pDVar4 != (DynamicBlock *)0x0) {
        pDVar4->prev = (DynamicBlock *)pZVar3;
      }
      free(pZVar34);
      return;
    }
  }
  _releaseDynamic();
  pZVar34 = (ZoneHeap *)this->_slots[1];
  pZVar12 = (ZoneHeap *)0x0;
  if (in_RCX <= pZVar34) {
    return;
  }
  pZVar23 = (ZoneHeap *)((long)in_RCX * (long)extraout_RDX);
  if (pZVar23 < in_RCX) {
    return;
  }
  if (((ZoneHeap *)p)->_zone == (Zone *)0x0) {
    pcStack_58 = (code *)0x119377;
    ZoneVectorBase::_reserve();
    pZVar11 = this;
LAB_00119377:
    pcStack_58 = (code *)0x11937c;
    ZoneVectorBase::_reserve();
LAB_0011937c:
    pcStack_58 = (code *)0x119381;
    ZoneVectorBase::_reserve();
  }
  else {
    pcStack_58 = (code *)0x11928d;
    pZVar11 = (ZoneHeap *)_alloc((ZoneHeap *)p,(size_t)pZVar23,&uStack_40);
    if (pZVar11 == (ZoneHeap *)0x0) {
      return;
    }
    unaff_RBP = (ZoneHeap *)this->_zone;
    pSVar20 = this->_slots[0];
    pZStack_48 = extraout_RDX;
    if (pSVar20 != (Slot *)0x0) {
      pcStack_58 = (code *)0x1192b9;
      pZVar23 = unaff_RBP;
      pZStack_48 = extraout_RDX;
      memcpy(pZVar11,unaff_RBP,(long)pSVar20 * (long)extraout_RDX);
      pSVar20 = extraout_RDX_00;
    }
    unaff_RBX = this;
    if (unaff_RBP == (ZoneHeap *)0x0) {
LAB_00119342:
      pZVar12 = (ZoneHeap *)0x0;
      this->_slots[1] = (Slot *)(uStack_40 / (ulong)pZStack_48);
      if (in_RCX <= (ZoneHeap *)(uStack_40 / (ulong)pZStack_48)) {
        this->_zone = (Zone *)pZVar11;
        return;
      }
      goto LAB_00119377;
    }
    if (((ZoneHeap *)p)->_zone == (Zone *)0x0) goto LAB_0011937c;
    pZVar34 = (ZoneHeap *)((long)pZVar34 * (long)pZStack_48);
    if (pZVar34 != (ZoneHeap *)0x0) {
      if (pZVar34 < (ZoneHeap *)0x201) {
        if (pZVar34 < (ZoneHeap *)0x81) {
          pZVar34 = (ZoneHeap *)((ulong)((long)pZVar34[0x55555555]._slots + 0x17U) >> 5);
        }
        else {
          pZVar34 = (ZoneHeap *)(((ulong)((long)pZVar34[0xaaaaaaa9]._slots + 0x17U) >> 6) + 4);
        }
        unaff_RBP->_zone = (Zone *)((ZoneHeap *)p)->_slots[(ulong)pZVar34 & 0xffffffff];
        ((ZoneHeap *)p)->_slots[(ulong)pZVar34 & 0xffffffff] = (Slot *)unaff_RBP;
      }
      else {
        pcStack_58 = (code *)0x119314;
        pZVar23 = unaff_RBP;
        _releaseDynamic((ZoneHeap *)p,unaff_RBP,(size_t)pSVar20);
        pZVar34 = pZStack_48;
      }
      goto LAB_00119342;
    }
  }
  pcStack_58 = ZoneVectorBase::_resize;
  ZoneVectorBase::_reserve();
  pZVar33 = (ZoneHeap *)pZVar11->_slots[0];
  pZStack_70 = unaff_RBX;
  pZStack_68 = (ZoneHeap *)p;
  pZStack_60 = in_RCX;
  if (pZVar12 <= (ZoneHeap *)pZVar11->_slots[1]) {
LAB_001193a1:
    if (pZVar33 <= pZVar12 && (long)pZVar12 - (long)pZVar33 != 0) {
      pZStack_80 = (ZoneHeap *)0x1193be;
      memset((uint8_t **)((long)&pZVar11->_zone->_ptr + (long)pZVar33 * (long)sizeOfT),0,
             ((long)pZVar12 - (long)pZVar33) * (long)sizeOfT);
    }
    pZVar11->_slots[0] = (Slot *)pZVar12;
    return;
  }
  pZVar16 = (ZoneHeap *)((long)pZVar12 - (long)pZVar33);
  pZStack_80 = (ZoneHeap *)0x1193e1;
  pZVar24 = pZVar11;
  EVar9 = ZoneVectorBase::_grow((ZoneVectorBase *)pZVar11,pZVar23,(size_t)sizeOfT,(size_t)pZVar16);
  if (EVar9 != 0) {
    return;
  }
  if (pZVar12 <= (ZoneHeap *)pZVar11->_slots[1]) goto LAB_001193a1;
  pZStack_80 = (ZoneHeap *)ZoneBitVector::_resize;
  ZoneVectorBase::_resize();
  pZStack_a8 = pZVar12;
  pZStack_a0 = pZVar33;
  pZStack_98 = pZVar34;
  pZStack_90 = pZVar11;
  pZStack_80 = unaff_RBP;
  if (pZVar16 < extraout_RDX_01) {
    uStack_c8 = 0x1196cc;
    ZoneBitVector::_resize();
    return;
  }
  pZVar34 = (ZoneHeap *)pZVar24->_slots[0];
  if (extraout_RDX_01 <= pZVar34) {
    if (((ulong)extraout_RDX_01 & 0x3f) != 0) {
      ppuVar1 = &pZVar24->_zone->_ptr + ((ulong)extraout_RDX_01 >> 6);
      *ppuVar1 = (uint8_t *)((ulong)*ppuVar1 & ~(-1L << (sbyte)((ulong)extraout_RDX_01 & 0x3f)));
    }
    goto LAB_001196b2;
  }
  pZVar12 = (ZoneHeap *)pZVar24->_zone;
  pZVar11 = sizeOfT;
  if (extraout_RDX_01 <= (ZoneHeap *)pZVar24->_slots[1]) {
LAB_0011957f:
    pZVar16 = (ZoneHeap *)((ulong)pZVar34 >> 6);
    uVar29 = (uint)extraout_RDX_01 & 0x3f;
    sVar14 = (sbyte)uVar29;
    pSVar20 = (Slot *)-(in_R8 & 0xff);
    pZVar34 = (ZoneHeap *)((ulong)pZVar34 & 0x3f);
    if (pZVar34 != (ZoneHeap *)0x0) {
      this_00 = (ZoneHeap *)((ulong)extraout_RDX_01 >> 6);
      sVar15 = 0;
      if ((pZVar16 == this_00) && (sVar15 = sVar14, uVar29 <= (uint)pZVar34)) {
        uStack_c8 = 0x1196e5;
        ZoneBitVector::_resize();
LAB_001196e5:
        uStack_c8 = 0x1196ea;
        ZoneBitVector::_resize();
        goto LAB_001196ea;
      }
      pZVar12->_slots[(long)((long)&pZVar16[-1]._dynamicBlocks + 7)] =
           (Slot *)((ulong)pZVar12->_slots[(long)((long)&pZVar16[-1]._dynamicBlocks + 7)] |
                   (long)pSVar20 << (sVar15 - (char)pZVar34 & 0x3fU));
      pZVar16 = (ZoneHeap *)((long)&pZVar16->_zone + 1);
    }
    auVar8 = _DAT_001329e0;
    auVar7 = _DAT_001329d0;
    uVar25 = (ulong)(extraout_RDX_01->_slots + 7) >> 6;
    lVar30 = uVar25 - 1;
    uVar28 = (ulong)((ZoneHeap *)(lVar30 * 0x40) == extraout_RDX_01);
    pZVar34 = (ZoneHeap *)(lVar30 - uVar28);
    if (pZVar16 <= pZVar34) {
      puVar26 = (undefined1 *)(uVar25 - uVar28);
      puVar27 = (undefined1 *)((long)&pZVar16->_zone + 1);
      if (puVar26 <= puVar27) {
        puVar26 = puVar27;
      }
      puVar27 = puVar26 + (-1 - (long)pZVar16);
      auVar35._8_4_ = (int)puVar27;
      auVar35._0_8_ = puVar27;
      auVar35._12_4_ = (int)((ulong)puVar27 >> 0x20);
      uVar28 = 0;
      auVar35 = auVar35 ^ _DAT_001329e0;
      do {
        auVar36._8_4_ = (int)uVar28;
        auVar36._0_8_ = uVar28;
        auVar36._12_4_ = (int)(uVar28 >> 0x20);
        auVar37 = (auVar36 | auVar7) ^ auVar8;
        if ((bool)(~(auVar37._4_4_ == auVar35._4_4_ && auVar35._0_4_ < auVar37._0_4_ ||
                    auVar35._4_4_ < auVar37._4_4_) & 1)) {
          pZVar12->_slots[(long)pZVar16->_slots + (uVar28 - 9)] = pSVar20;
        }
        if ((auVar37._12_4_ != auVar35._12_4_ || auVar37._8_4_ <= auVar35._8_4_) &&
            auVar37._12_4_ <= auVar35._12_4_) {
          pZVar12->_slots[(long)pZVar16->_slots + (uVar28 - 8)] = pSVar20;
        }
        uVar28 = uVar28 + 2;
      } while (((ulong)(puVar26 + (1 - (long)pZVar16)) & 0xfffffffffffffffe) != uVar28);
    }
    if (((ulong)extraout_RDX_01 & 0x3f) != 0) {
      puVar2 = (ulong *)((long)pZVar12 + (long)pZVar34 * 8);
      *puVar2 = *puVar2 & ~(-1L << sVar14);
    }
LAB_001196b2:
    pZVar24->_slots[0] = (Slot *)extraout_RDX_01;
    return;
  }
  pZVar11 = (ZoneHeap *)((ulong)((long)pZVar16->_slots + 0x37) & 0xffffffffffffffc0);
  if (pZVar11 < extraout_RDX_01) {
    return;
  }
  if (pZVar23->_zone == (Zone *)0x0) {
    uStack_c8 = 0x1196d8;
    pZVar16 = pZVar24;
    ZoneBitVector::_resize();
    __dest = extraout_RAX;
    size_00 = extraout_RDX_04;
LAB_001196d8:
    this_00 = pZVar11;
  }
  else {
    uStack_bc = (uint)in_R8;
    uStack_c8 = 0x119461;
    pZVar16 = pZVar23;
    __dest = (ZoneHeap *)_alloc(pZVar23,(ulong)pZVar11 >> 3,(size_t *)&pZStack_b0);
    in_R8 = (ulong)uStack_bc;
    if (__dest == (ZoneHeap *)0x0) {
      return;
    }
    size_00 = extraout_RDX_02;
    this_00 = (ZoneHeap *)((long)pZStack_b0 * 8);
    if ((ZoneHeap *)((long)pZStack_b0 * 8) < pZStack_b0) goto LAB_001196d8;
  }
  if (pZVar34 != (ZoneHeap *)0x0) {
    uStack_c8 = 0x1194a8;
    pZVar16 = __dest;
    pZStack_b8 = this_00;
    memcpy(__dest,pZVar12,((ulong)(pZVar34->_slots + 7) >> 6) - 1);
    in_R8 = (ulong)uStack_bc;
    size_00 = extraout_RDX_03;
    this_00 = pZStack_b8;
    pZVar11 = __dest;
  }
  pZVar33 = pZVar23;
  if (pZVar12 == (ZoneHeap *)0x0) {
LAB_00119578:
    pZVar24->_zone = (Zone *)__dest;
    pZVar24->_slots[1] = (Slot *)this_00;
    pZVar12 = __dest;
    goto LAB_0011957f;
  }
  if (pZVar23->_zone == (Zone *)0x0) goto LAB_001196e5;
  pSVar20 = pZVar24->_slots[1];
  if ((Slot *)0x7 < pSVar20) {
    if (pSVar20 < (Slot *)0x1008) {
      if (pSVar20 < (Slot *)0x408) {
        uVar29 = (uint)(((ulong)pSVar20 >> 3) + 0x1fffffffff >> 5);
      }
      else {
        uVar29 = (int)(((ulong)pSVar20 >> 3) + 0x3fffffff7f >> 6) + 4;
      }
      pZVar12->_zone = (Zone *)pZVar23->_slots[uVar29];
      pZVar23->_slots[uVar29] = (Slot *)pZVar12;
    }
    else {
      uStack_c8 = 0x119546;
      _releaseDynamic(pZVar23,pZVar12,size_00);
      in_R8 = (ulong)uStack_bc;
      pZVar33 = this_00;
      pZVar11 = __dest;
    }
    goto LAB_00119578;
  }
LAB_001196ea:
  uStack_c8 = 0x1196ef;
  ZoneBitVector::_resize();
  pSVar13 = pZVar16->_slots[1];
  pSVar20 = (Slot *)0x80;
  if ((Slot *)0x7f < pSVar13) {
    if (pSVar13 < (Slot *)0x4000001) {
      pSVar20 = (Slot *)((long)pSVar13 * 2);
    }
    else {
      pSVar20 = pSVar13 + 0x800000;
    }
  }
  pSVar17 = (Slot *)((long)&pZVar16->_slots[0]->next + 1);
  if ((pSVar13 <= pSVar20) || (pSVar20 = pSVar17, pSVar13 < pSVar17)) {
    ZoneBitVector::_resize
              ((ZoneBitVector *)pZVar16,this_00,(size_t)pSVar17,(size_t)pSVar20,
               SUB81(extraout_RDX_05 & 0xffffffff,0));
    return;
  }
  uStack_d0 = 0x11973d;
  uStack_c8 = extraout_RDX_05 & 0xffffffff;
  ZoneBitVector::_append();
  if (extraout_RDX_06 <= this_00) {
    return;
  }
  if ((ZoneHeap *)pZVar16->_slots[0] < this_00) {
    pZStack_d8 = (ZoneHeap *)0x1198c9;
    ZoneBitVector::fill();
LAB_001198c9:
    pZStack_d8 = (ZoneHeap *)0x1198ce;
    ZoneBitVector::fill();
LAB_001198ce:
    pZStack_d8 = (ZoneHeap *)0x1198d3;
    ZoneBitVector::fill();
  }
  else {
    if ((ZoneHeap *)pZVar16->_slots[0] < extraout_RDX_06) goto LAB_001198c9;
    pZVar16 = (ZoneHeap *)pZVar16->_zone;
    if (pZVar16 == (ZoneHeap *)0x0) goto LAB_001198ce;
    cVar6 = (char)pSVar17;
    uVar28 = (ulong)this_00 >> 6;
    uVar22 = (uint)this_00 & 0x3f;
    this_00 = (ZoneHeap *)(ulong)uVar22;
    uVar25 = (ulong)extraout_RDX_06 >> 6;
    uVar29 = (uint)extraout_RDX_06 & 0x3f;
    sVar14 = (sbyte)uVar29;
    if (this_00 == (ZoneHeap *)0x0) {
LAB_001197dc:
      auVar8 = _DAT_001329e0;
      auVar7 = _DAT_001329d0;
      lVar30 = uVar25 - uVar28;
      if (uVar28 <= uVar25 && lVar30 != 0) {
        lVar31 = lVar30 + -1;
        auVar37._8_4_ = (int)lVar31;
        auVar37._0_8_ = lVar31;
        auVar37._12_4_ = (int)((ulong)lVar31 >> 0x20);
        uVar32 = 0;
        auVar37 = auVar37 ^ _DAT_001329e0;
        do {
          auVar38._8_4_ = (int)uVar32;
          auVar38._0_8_ = uVar32;
          auVar38._12_4_ = (int)(uVar32 >> 0x20);
          auVar38 = (auVar38 | auVar7) ^ auVar8;
          if ((bool)(~(auVar38._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar38._0_4_ ||
                      auVar37._4_4_ < auVar38._4_4_) & 1)) {
            pZVar16->_slots[uVar28 + (uVar32 - 1)] = (Slot *)-((ulong)pSVar17 & 0xff);
          }
          if ((auVar38._12_4_ != auVar37._12_4_ || auVar38._8_4_ <= auVar37._8_4_) &&
              auVar38._12_4_ <= auVar37._12_4_) {
            pZVar16->_slots[uVar28 + uVar32] = (Slot *)-((ulong)pSVar17 & 0xff);
          }
          uVar32 = uVar32 + 2;
        } while ((lVar30 + 1U & 0xfffffffffffffffe) != uVar32);
      }
      if (((ulong)extraout_RDX_06 & 0x3f) != 0) {
        uVar28 = -1L << sVar14;
        if (cVar6 == '\0') {
          pZVar16->_slots[uVar25 - 1] = (Slot *)((ulong)pZVar16->_slots[uVar25 - 1] & uVar28);
        }
        else {
          pZVar16->_slots[uVar25 - 1] = (Slot *)((ulong)pZVar16->_slots[uVar25 - 1] | ~uVar28);
        }
      }
      return;
    }
    sVar15 = (sbyte)uVar22;
    if (uVar28 != uVar25) {
      if (cVar6 == '\0') {
        pZVar16->_slots[uVar28 - 1] =
             (Slot *)((ulong)pZVar16->_slots[uVar28 - 1] & ~(-1L << sVar15));
      }
      else {
        pZVar16->_slots[uVar28 - 1] = (Slot *)((ulong)pZVar16->_slots[uVar28 - 1] | -1L << sVar15);
      }
      uVar28 = uVar28 + 1;
      goto LAB_001197dc;
    }
    if (uVar22 < uVar29) {
      uVar25 = ~(-1L << (sVar14 - sVar15 & 0x3fU)) << sVar15;
      if (cVar6 != '\0') {
        pZVar16->_slots[uVar28 - 1] = (Slot *)((ulong)pZVar16->_slots[uVar28 - 1] | uVar25);
        return;
      }
      pZVar16->_slots[uVar28 - 1] = (Slot *)((ulong)pZVar16->_slots[uVar28 - 1] & ~uVar25);
      return;
    }
  }
  pZStack_d8 = (ZoneHeap *)ZoneStackBase::_init;
  ZoneBitVector::fill();
  pZVar3 = pZVar16->_zone;
  pZStack_e8 = pZVar24;
  pZStack_e0 = pZVar11;
  pZStack_d8 = pZVar34;
  if (pZVar3 != (Zone *)0x0) {
    if ((Block *)pZVar16->_slots[0] != (Block *)0x0) {
      if (pZVar3->_ptr == (uint8_t *)0x0) {
        pZStack_100 = (ZoneHeap *)0x119983;
        pZVar23 = this_00;
        pZVar11 = pZVar16;
        ZoneStackBase::_init();
        pZVar12 = (ZoneHeap *)pZVar11->_zone;
        pZStack_120 = pZVar16;
        pZStack_118 = pZVar33;
        pZStack_110 = this_00;
        pZStack_100 = pZVar34;
        if (pZVar12 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar28 = (ulong)pZVar23 & 0xffffffff;
          pSVar20 = pZVar11->_slots[uVar28];
          if (pSVar20[2].next != pSVar20[3].next) {
            if (pZVar12->_zone != (Zone *)0x0) {
              pSVar13 = (Slot *)_alloc(pZVar12,0x200,&sStack_128);
              if (pSVar13 == (Slot *)0x0) {
                return;
              }
              pSVar13[uVar28].next = (Slot *)0x0;
              pSVar13[(int)pZVar23 == 0].next = pSVar20;
              pSVar17 = (Slot *)((long)&pSVar13->next + extraout_RDX_08);
              pSVar13[2].next = pSVar17;
              pSVar13[3].next = pSVar17;
              pSVar20[uVar28].next = pSVar13;
              pZVar11->_slots[uVar28] = pSVar13;
              return;
            }
            goto LAB_00119a0e;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_00119a0e:
        ZoneStackBase::_prepareBlock();
        return;
      }
      pBVar5 = (Block *)pZVar16->_slots[0];
      pBVar21 = pZVar3[2]._block;
      do {
        pBVar18 = pBVar5;
        pBVar5 = pBVar18->next;
        pBVar18->prev = pBVar21;
        pZVar3[2]._block = pBVar18;
        pBVar21 = pBVar18;
      } while (pBVar5 != (Block *)0x0);
    }
    pZVar16->_zone = (Zone *)0x0;
    pZVar16->_slots[0] = (Slot *)0x0;
    pZVar16->_slots[1] = (Slot *)0x0;
  }
  if (this_00 != (ZoneHeap *)0x0) {
    if (this_00->_zone == (Zone *)0x0) {
      pZStack_100 = (ZoneHeap *)0x119977;
      ZoneStackBase::_init();
    }
    else {
      pZStack_100 = (ZoneHeap *)0x119944;
      pSVar20 = (Slot *)_alloc(this_00,0x200,asStack_f8);
      if (pSVar20 != (Slot *)0x0) {
        pSVar13 = (Slot *)((long)&pSVar20->next + extraout_RDX_07);
        pSVar20->next = (Slot *)0x0;
        pSVar20[1].next = (Slot *)0x0;
        pSVar20[2].next = pSVar13;
        pSVar20[3].next = pSVar13;
        pZVar16->_zone = (Zone *)this_00;
        pZVar16->_slots[0] = pSVar20;
        pZVar16->_slots[1] = pSVar20;
      }
    }
  }
  return;
}

Assistant:

void ZoneHeap::_releaseDynamic(void* p, size_t size) noexcept {
  ASMJIT_ASSERT(isInitialized());
  //printf("RELEASING DYNAMIC %p of size %d\n", p, int(size));

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneHeap_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  Internal::releaseMemory(block);
}